

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O0

void PrintOutput(sunrealtype t,sunrealtype umax,long nst)

{
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  printf("At t = %4.2f   max.norm(u) =%14.6e   nst = %4ld\n",in_XMM0_Qa,in_XMM1_Qa,in_RDI);
  return;
}

Assistant:

static void PrintOutput(sunrealtype t, sunrealtype umax, long int nst)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("At t = %4.2Lf   max.norm(u) =%14.6Le   nst = %4ld\n", t, umax, nst);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("At t = %4.2f   max.norm(u) =%14.6e   nst = %4ld\n", t, umax, nst);
#else
  printf("At t = %4.2f   max.norm(u) =%14.6e   nst = %4ld\n", t, umax, nst);
#endif

  return;
}